

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

ssize_t __thiscall fmt::v5::file::write(file *this,int __fd,void *__buf,size_t __n)

{
  size_t __n_00;
  ssize_t sVar1;
  int *piVar2;
  char *s;
  type tVar3;
  undefined4 in_register_00000034;
  bool bVar4;
  system_error *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  RWResult result;
  undefined4 in_stack_ffffffffffffffa0;
  void *__buf_00;
  file *pfVar5;
  int iVar6;
  
  pfVar5 = this;
  do {
    iVar6 = this->fd_;
    __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
    __n_00 = anon_unknown.dwarf_81c34::convert_rwcount((size_t)__buf);
    sVar1 = ::write(iVar6,__buf_00,__n_00);
    bVar4 = false;
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
    iVar6 = (int)((ulong)pfVar5 >> 0x20);
  } while (bVar4);
  if (sVar1 < 0) {
    s = (char *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)CONCAT44(*piVar2,in_stack_ffffffffffffffa0),s);
    system_error::system_error<>(unaff_retaddr,iVar6,(string_view)in_stack_00000008);
    __cxa_throw(s,&system_error::typeinfo,system_error::~system_error);
  }
  tVar3 = internal::to_unsigned<long>((long)__buf_00);
  return tVar3;
}

Assistant:

std::size_t file::write(const void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(write(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(system_error(errno, "cannot write to file"));
  return internal::to_unsigned(result);
}